

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeFlushCase::init
          (MapBufferRangeFlushCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_198;
  
  local_198.m_log =
       ((this->
        super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Testing glMapBufferRange(), glFlushMappedBufferRange() and glUnmapBuffer() function call performance.\n"
                 );
  pcVar2 = "Half of the buffer is mapped.";
  if (this->m_fullUpload != false) {
    pcVar2 = "The whole buffer is mapped.";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,"\n");
  pcVar2 = "The whole mapped range is flushed in one flush call.";
  if ((this->m_flushPartial & 1U) != 0) {
    pcVar2 = "Half of the buffer range is flushed.";
  }
  pcVar3 = 
  "The mapped range is partitioned to 4 subranges and each partition is flushed separately.";
  if (this->m_flushInParts == false) {
    pcVar3 = pcVar2;
  }
  std::operator<<((ostream *)this_00,pcVar3);
  std::operator<<((ostream *)this_00,"\n");
  pcVar2 = 
  "The buffer has not been used before mapping and is allocated with unspecified contents.\n";
  if (this->m_useUnusedUnspecifiedBuffer == false) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "The buffer has not been used before mapping and is allocated with specified contents.\n"
  ;
  if (this->m_useUnusedSpecifiedBuffer == false) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "The buffer has previously been used in a drawing operation.\n";
  if (((this->m_useUnusedUnspecifiedBuffer | this->m_useUnusedSpecifiedBuffer) & 1U) != 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,"Map bits:\n");
  pcVar2 = "\tGL_MAP_WRITE_BIT\n";
  if ((this->m_mapFlags & 2) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_READ_BIT\n";
  if ((this->m_mapFlags & 1) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_INVALIDATE_RANGE_BIT\n";
  if ((this->m_mapFlags & 4) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_INVALIDATE_BUFFER_BIT\n";
  if ((this->m_mapFlags & 8) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_UNSYNCHRONIZED_BIT\n";
  if ((this->m_mapFlags & 0x20) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_FLUSH_EXPLICIT_BIT\n";
  if ((this->m_mapFlags & 0x10) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
          ::init(&this->
                  super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void MapBufferRangeFlushCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing glMapBufferRange(), glFlushMappedBufferRange() and glUnmapBuffer() function call performance.\n"
		<< ((m_fullUpload) ? ("The whole buffer is mapped.") : ("Half of the buffer is mapped.")) << "\n"
		<< ((m_flushInParts) ?
			("The mapped range is partitioned to 4 subranges and each partition is flushed separately.") :
			(m_flushPartial) ?
				("Half of the buffer range is flushed.") :
				("The whole mapped range is flushed in one flush call.")) << "\n"
		<< ((m_useUnusedUnspecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with unspecified contents.\n") : (""))
		<< ((m_useUnusedSpecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with specified contents.\n") : (""))
		<< ((!m_useUnusedSpecifiedBuffer && !m_useUnusedUnspecifiedBuffer) ? ("The buffer has previously been used in a drawing operation.\n") : (""))
		<< "Map bits:\n"
		<< ((m_mapFlags & GL_MAP_WRITE_BIT) ? ("\tGL_MAP_WRITE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_READ_BIT) ? ("\tGL_MAP_READ_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_RANGE_BIT) ? ("\tGL_MAP_INVALIDATE_RANGE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_BUFFER_BIT) ? ("\tGL_MAP_INVALIDATE_BUFFER_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_UNSYNCHRONIZED_BIT) ? ("\tGL_MAP_UNSYNCHRONIZED_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_FLUSH_EXPLICIT_BIT) ? ("\tGL_MAP_FLUSH_EXPLICIT_BIT\n") : (""))
		<< tcu::TestLog::EndMessage;

	BasicUploadCase<MapBufferRangeFlushDuration>::init();
}